

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

void __thiscall helics::CommonCore::routeMessage(CommonCore *this,ActionMessage *cmd)

{
  GlobalFederateId global_fedid;
  _func_int *UNRECOVERED_JUMPTABLE;
  bool bVar1;
  FederateStates FVar2;
  route_id rVar3;
  FederateState *this_00;
  optional<helics::ActionMessage> rep;
  _Optional_payload_base<helics::ActionMessage> _Stack_e8;
  
  global_fedid.gid = (cmd->dest_id).gid;
  if ((global_fedid.gid == 0) || (global_fedid.gid == (this->super_BrokerBase).higher_broker_id.gid)
     ) {
    (*(this->super_Core)._vptr_Core[0x6b])(this,0,cmd);
    return;
  }
  if (global_fedid.gid == (this->super_BrokerBase).global_broker_id_local.gid) {
    processCommandsForCore(this,cmd);
    return;
  }
  if (global_fedid.gid == (this->filterFedID)._M_i.gid) {
    FilterFederate::handleMessage(this->filterFed,cmd);
    return;
  }
  if (global_fedid.gid == (this->translatorFedID)._M_i.gid) {
    TranslatorFederate::handleMessage(this->translatorFed,cmd);
    return;
  }
  bVar1 = isLocal(this,global_fedid);
  if (bVar1) {
    this_00 = getFederateCore(this,global_fedid);
    if (this_00 != (FederateState *)0x0) {
      FVar2 = FederateState::getState(this_00);
      if (FVar2 != FINISHED) {
        FederateState::addAction(this_00,cmd);
        return;
      }
      FederateState::processPostTerminationAction
                ((optional<helics::ActionMessage> *)&_Stack_e8,this_00,cmd);
      if (_Stack_e8._M_engaged == true) {
        routeMessage(this,(ActionMessage *)&_Stack_e8);
      }
      std::_Optional_payload_base<helics::ActionMessage>::_M_reset(&_Stack_e8);
    }
    return;
  }
  rVar3 = getRoute(this,global_fedid);
  UNRECOVERED_JUMPTABLE = (this->super_Core)._vptr_Core[0x6b];
  (*UNRECOVERED_JUMPTABLE)(this,(ulong)(uint)rVar3.rid,cmd,UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

void CommonCore::routeMessage(ActionMessage&& cmd)
{
    const GlobalFederateId dest = cmd.dest_id;
    if ((dest == parent_broker_id) || (dest == higher_broker_id)) {
        transmit(parent_route_id, cmd);
    } else if (dest == global_broker_id_local) {
        processCommandsForCore(cmd);
    } else if (dest == filterFedID) {
        filterFed->handleMessage(cmd);
    } else if (dest == translatorFedID) {
        translatorFed->handleMessage(cmd);
    } else if (isLocal(dest)) {
        auto* fed = getFederateCore(dest);
        if (fed != nullptr) {
            if (fed->getState() != FederateStates::FINISHED) {
                fed->addAction(std::move(cmd));
            } else {
                auto rep = fed->processPostTerminationAction(cmd);
                if (rep) {
                    routeMessage(*rep);
                }
            }
        }
    } else {
        auto route = getRoute(dest);
        transmit(route, cmd);
    }
}